

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

ssl_verify_result_t bssl::ssl_verify_peer_cert(SSL_HANDSHAKE *hs)

{
  _func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *p_Var1;
  ssl_ctx_st *psVar2;
  _func_int_SSL_ptr_void_ptr *p_Var3;
  _Head_base<0UL,_crypto_buffer_st_*,_false> __p;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> __p_00;
  ssl_session_st *psVar4;
  bool bVar5;
  ssl_verify_result_t sVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  CRYPTO_BUFFER *buf;
  CRYPTO_BUFFER *buf_00;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint desc;
  SSL *ssl;
  size_t i;
  ulong i_00;
  Span<const_unsigned_char> lhs;
  Span<const_unsigned_char> rhs;
  uint8_t alert;
  undefined7 uStack_47;
  ssl_session_st *local_40;
  SSL *local_38;
  
  ssl = hs->ssl;
  local_40 = (ssl->s3->established_session)._M_t.
             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  if (local_40 != (ssl_session_st *)0x0) {
    local_38 = ssl;
    if ((ssl->field_0xa4 & 1) != 0) {
      __assert_fail("!ssl->server",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0xec,"enum ssl_verify_result_t bssl::ssl_verify_peer_cert(SSL_HANDSHAKE *)");
    }
    sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)
                           (local_40->certs)._M_t.
                           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>);
    sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)
                           (((hs->new_session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs).
                           _M_t.
                           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>);
    if (sVar8 == sVar9) {
      i_00 = 0;
      do {
        sVar8 = OPENSSL_sk_num((OPENSSL_STACK *)
                               (((hs->new_session)._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs
                               )._M_t.
                               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                              );
        psVar4 = local_40;
        if (sVar8 <= i_00) {
          UpRef((bssl *)&alert,&local_40->ocsp_response);
          __p._M_head_impl = _alert;
          _alert = (crypto_buffer_st *)0x0;
          std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                     &((hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->ocsp_response,
                     __p._M_head_impl);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&alert);
          UpRef((bssl *)&alert,&psVar4->signed_cert_timestamp_list);
          __p_00._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)_alert;
          _alert = (crypto_buffer_st *)0x0;
          std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                     &((hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                      signed_cert_timestamp_list,
                     (pointer)__p_00._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&alert);
          ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result =
               psVar4->verify_result;
          return ssl_verify_ok;
        }
        buf = (CRYPTO_BUFFER *)
              OPENSSL_sk_value((OPENSSL_STACK *)
                               (local_40->certs)._M_t.
                               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl,
                               i_00);
        buf_00 = (CRYPTO_BUFFER *)
                 OPENSSL_sk_value((OPENSSL_STACK *)
                                  (((hs->new_session)._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                  certs)._M_t.
                                  super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                  ,i_00);
        puVar10 = CRYPTO_BUFFER_data(buf);
        sVar8 = CRYPTO_BUFFER_len(buf);
        puVar11 = CRYPTO_BUFFER_data(buf_00);
        sVar9 = CRYPTO_BUFFER_len(buf_00);
        lhs.size_ = sVar8;
        lhs.data_ = puVar10;
        rhs.size_ = sVar9;
        rhs.data_ = puVar11;
        bVar5 = internal::operator!=(lhs,rhs);
        i_00 = i_00 + 1;
      } while (!bVar5);
      iVar7 = 0xfc;
    }
    else {
      iVar7 = 0xef;
    }
    ERR_put_error(0x10,0,0x111,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                  ,iVar7);
    ssl = local_38;
    desc = 0x2f;
    goto LAB_0013fe32;
  }
  alert = 0x2e;
  p_Var1 = hs->config->custom_verify_callback;
  if (p_Var1 == (_func_ssl_verify_result_t_SSL_ptr_uint8_t_ptr *)0x0) {
    bVar5 = (*((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
              session_verify_cert_chain)
                      ((hs->new_session)._M_t.
                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,hs,&alert);
    sVar6 = (ssl_verify_result_t)!bVar5;
LAB_0013ff0f:
    if (sVar6 != ssl_verify_ok) {
      if (sVar6 != ssl_verify_invalid) {
        return sVar6;
      }
      ERR_put_error(0x10,0,0x7d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x128);
      desc = (uint)alert;
      goto LAB_0013fe32;
    }
  }
  else {
    sVar6 = (*p_Var1)(ssl,&alert);
    if (sVar6 == ssl_verify_invalid) {
      bVar5 = hs->config->verify_mode == '\0';
      if (bVar5) {
        ERR_clear_error();
      }
      sVar6 = (ssl_verify_result_t)!bVar5;
      ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0x32;
      goto LAB_0013ff0f;
    }
    if (sVar6 != ssl_verify_ok) goto LAB_0013ff0f;
    ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0;
  }
  if ((ssl->field_0xa4 & 1) != 0) {
    return ssl_verify_ok;
  }
  if ((hs->config->field_0x10d & 4) == 0) {
    return ssl_verify_ok;
  }
  psVar2 = (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  p_Var3 = psVar2->legacy_ocsp_callback;
  if (p_Var3 == (_func_int_SSL_ptr_void_ptr *)0x0) {
    return ssl_verify_ok;
  }
  iVar7 = (*p_Var3)(ssl,psVar2->legacy_ocsp_callback_arg);
  if (0 < iVar7) {
    return ssl_verify_ok;
  }
  ERR_put_error(0x10,0,0x121,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                ,0x134);
  desc = 0x50;
  if (iVar7 == 0) {
    desc = 0x71;
  }
LAB_0013fe32:
  ssl_send_alert(ssl,2,desc);
  return ssl_verify_invalid;
}

Assistant:

enum ssl_verify_result_t ssl_verify_peer_cert(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  const SSL_SESSION *prev_session = ssl->s3->established_session.get();
  if (prev_session != NULL) {
    // If renegotiating, the server must not change the server certificate. See
    // https://mitls.org/pages/attacks/3SHAKE. We never resume on renegotiation,
    // so this check is sufficient to ensure the reported peer certificate never
    // changes on renegotiation.
    assert(!ssl->server);
    if (sk_CRYPTO_BUFFER_num(prev_session->certs.get()) !=
        sk_CRYPTO_BUFFER_num(hs->new_session->certs.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_CERT_CHANGED);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return ssl_verify_invalid;
    }

    for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(hs->new_session->certs.get());
         i++) {
      const CRYPTO_BUFFER *old_cert =
          sk_CRYPTO_BUFFER_value(prev_session->certs.get(), i);
      const CRYPTO_BUFFER *new_cert =
          sk_CRYPTO_BUFFER_value(hs->new_session->certs.get(), i);
      if (Span(CRYPTO_BUFFER_data(old_cert), CRYPTO_BUFFER_len(old_cert)) !=
          Span(CRYPTO_BUFFER_data(new_cert), CRYPTO_BUFFER_len(new_cert))) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_SERVER_CERT_CHANGED);
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
        return ssl_verify_invalid;
      }
    }

    // The certificate is identical, so we may skip re-verifying the
    // certificate. Since we only authenticated the previous one, copy other
    // authentication from the established session and ignore what was newly
    // received.
    hs->new_session->ocsp_response = UpRef(prev_session->ocsp_response);
    hs->new_session->signed_cert_timestamp_list =
        UpRef(prev_session->signed_cert_timestamp_list);
    hs->new_session->verify_result = prev_session->verify_result;
    return ssl_verify_ok;
  }

  uint8_t alert = SSL_AD_CERTIFICATE_UNKNOWN;
  enum ssl_verify_result_t ret;
  if (hs->config->custom_verify_callback != nullptr) {
    ret = hs->config->custom_verify_callback(ssl, &alert);
    switch (ret) {
      case ssl_verify_ok:
        hs->new_session->verify_result = X509_V_OK;
        break;
      case ssl_verify_invalid:
        // If |SSL_VERIFY_NONE|, the error is non-fatal, but we keep the result.
        if (hs->config->verify_mode == SSL_VERIFY_NONE) {
          ERR_clear_error();
          ret = ssl_verify_ok;
        }
        hs->new_session->verify_result = X509_V_ERR_APPLICATION_VERIFICATION;
        break;
      case ssl_verify_retry:
        break;
    }
  } else {
    ret = ssl->ctx->x509_method->session_verify_cert_chain(
              hs->new_session.get(), hs, &alert)
              ? ssl_verify_ok
              : ssl_verify_invalid;
  }

  if (ret == ssl_verify_invalid) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CERTIFICATE_VERIFY_FAILED);
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
  }

  // Emulate OpenSSL's client OCSP callback. OpenSSL verifies certificates
  // before it receives the OCSP, so it needs a second callback for OCSP.
  if (ret == ssl_verify_ok && !ssl->server &&
      hs->config->ocsp_stapling_enabled &&
      ssl->ctx->legacy_ocsp_callback != nullptr) {
    int cb_ret =
        ssl->ctx->legacy_ocsp_callback(ssl, ssl->ctx->legacy_ocsp_callback_arg);
    if (cb_ret <= 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_OCSP_CB_ERROR);
      ssl_send_alert(ssl, SSL3_AL_FATAL,
                     cb_ret == 0 ? SSL_AD_BAD_CERTIFICATE_STATUS_RESPONSE
                                 : SSL_AD_INTERNAL_ERROR);
      ret = ssl_verify_invalid;
    }
  }

  return ret;
}